

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::SmallVectorBase<slang::SourceLocation>::emplace_back<slang::SourceLocation_const&>
          (SmallVectorBase<slang::SourceLocation> *this,SourceLocation *args)

{
  ulong uVar1;
  SourceLocation *p;
  SourceLocation *pSVar2;
  SourceLocation *pSVar3;
  SourceLocation *pSVar4;
  long lVar5;
  long lVar6;
  SourceLocation *__src;
  size_type sVar7;
  ulong uVar8;
  
  __src = this->data_ + this->len;
  if (this->len != this->cap) {
    *__src = *args;
    sVar7 = this->len;
    this->len = sVar7 + 1;
    return this->data_ + sVar7;
  }
  if (this->len == 0xfffffffffffffff) {
    detail::throwLengthError();
  }
  uVar8 = this->len + 1;
  uVar1 = this->cap;
  if (uVar8 < uVar1 * 2) {
    uVar8 = uVar1 * 2;
  }
  if (0xfffffffffffffff - uVar1 < uVar1) {
    uVar8 = 0xfffffffffffffff;
  }
  lVar6 = (long)__src - (long)this->data_;
  pSVar2 = (SourceLocation *)operator_new(uVar8 * 8);
  *(SourceLocation *)((long)pSVar2 + lVar6) = *args;
  p = this->data_;
  sVar7 = this->len;
  lVar5 = (long)p + (sVar7 * 8 - (long)__src);
  pSVar3 = p;
  pSVar4 = pSVar2;
  if (lVar5 == 0) {
    pSVar3 = pSVar2;
    pSVar4 = p;
    if (sVar7 != 0) {
      do {
        *pSVar3 = *pSVar4;
        pSVar4 = pSVar4 + 1;
        pSVar3 = pSVar3 + 1;
      } while (pSVar4 != __src);
    }
  }
  else {
    for (; pSVar3 != __src; pSVar3 = pSVar3 + 1) {
      *pSVar4 = *pSVar3;
      pSVar4 = pSVar4 + 1;
    }
    memcpy((void *)((long)pSVar2 + lVar6 + 8),__src,(lVar5 - 8U & 0xfffffffffffffff8) + 8);
  }
  if (p != (SourceLocation *)this->firstElement) {
    operator_delete(p);
    sVar7 = this->len;
  }
  this->len = sVar7 + 1;
  this->cap = uVar8;
  this->data_ = pSVar2;
  return (reference)((long)pSVar2 + lVar6);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }